

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triangle.h
# Opt level: O1

pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *
anurbs::Triangle<3L>::closest_point(Vector *point,Vector *a,Vector *b,Vector *c)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *in_RDI;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  
  dVar4 = (b->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
          [0];
  dVar5 = (b->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
          [1];
  dVar6 = (a->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
          [0];
  dVar7 = (a->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
          [1];
  dVar11 = dVar4 - dVar6;
  dVar12 = dVar5 - dVar7;
  dVar1 = (b->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
          [2];
  dVar2 = (a->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
          [2];
  dVar10 = dVar1 - dVar2;
  dVar8 = (c->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
          [0];
  dVar9 = (c->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
          [1];
  dVar15 = dVar8 - dVar6;
  dVar16 = dVar9 - dVar7;
  dVar3 = (c->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
          [2];
  dVar17 = dVar3 - dVar2;
  dVar18 = dVar12 * dVar17 - dVar16 * dVar10;
  dVar19 = dVar10 * dVar15 - dVar17 * dVar11;
  dVar20 = dVar11 * dVar16 - dVar15 * dVar12;
  dVar13 = (point->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
           array[0] - dVar6;
  dVar14 = (point->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
           array[1] - dVar7;
  dVar22 = (point->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
           array[2] - dVar2;
  dVar21 = dVar20 * dVar20 + dVar19 * dVar19 + dVar18 * dVar18;
  dVar11 = ((dVar11 * dVar14 - dVar13 * dVar12) * dVar20 +
           (dVar10 * dVar13 - dVar22 * dVar11) * dVar19 +
           (dVar12 * dVar22 - dVar14 * dVar10) * dVar18) / dVar21;
  dVar21 = ((dVar13 * dVar16 - dVar14 * dVar15) * dVar20 +
           (dVar22 * dVar15 - dVar17 * dVar13) * dVar19 +
           (dVar14 * dVar17 - dVar16 * dVar22) * dVar18) / dVar21;
  dVar10 = (1.0 - dVar11) - dVar21;
  (in_RDI->first).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
  array[0] = dVar10;
  (in_RDI->first).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
  array[1] = dVar21;
  (in_RDI->first).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
  array[2] = dVar11;
  (in_RDI->second).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
  array[0] = dVar11 * dVar8 + dVar21 * dVar4 + dVar10 * dVar6;
  (in_RDI->second).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
  array[1] = dVar11 * dVar9 + dVar21 * dVar5 + dVar10 * dVar7;
  (in_RDI->second).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
  array[2] = dVar3 * dVar11 + dVar1 * dVar21 + dVar2 * dVar10;
  return in_RDI;
}

Assistant:

static std::pair<Parameter, Vector> closest_point(Vector point, Vector a, Vector b, Vector c)
    {
        Vector u = b - a;
        Vector v = c - a;
        Vector n = u.cross(v);
        Vector w = point - a;

        double r = u.cross(w).dot(n) / n.dot(n);
        double s = w.cross(v).dot(n) / n.dot(n);
        double t = 1.0 - r - s;

        Vector closest_point = t * a + s * b + r * c;

        return {Parameter(t, s, r), closest_point};
    }